

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O3

void __thiscall
njoy::ENDFtk::
InterpolationSequenceRecord<njoy::ENDFtk::section::Type<7,4>::TabulatedFunctions::ScatteringFunction>
::print<std::back_insert_iterator<std::__cxx11::string>>
          (InterpolationSequenceRecord<njoy::ENDFtk::section::Type<7,4>::TabulatedFunctions::ScatteringFunction>
           *this,back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *it,int MAT,int MF,int MT)

{
  ScatteringFunction *pSVar1;
  ScatteringFunction *entry;
  ScatteringFunction *this_00;
  
  record::InterpolationBase::print<std::back_insert_iterator<std::__cxx11::string>>
            ((InterpolationBase *)this,it,MAT,MF,MT);
  pSVar1 = *(ScatteringFunction **)(this + 0x68);
  for (this_00 = *(ScatteringFunction **)(this + 0x60); this_00 != pSVar1; this_00 = this_00 + 0xa8)
  {
    section::Type<7,4>::TabulatedFunctions::ScatteringFunction::
    print<std::back_insert_iterator<std::__cxx11::string>>(this_00,it,MAT,MF,MT);
  }
  return;
}

Assistant:

void print( OutputIterator& it, int MAT, int MF, int MT ) const {

  this->interpolation_.print( it, MAT, MF, MT );
  for ( const auto& entry : this->sequence_ ) {

    ENDFtk::print( entry, it, MAT, MF, MT );
  }
}